

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O1

void ZSTD_decompressSequencesSplitLitBuffer_cold_1(void)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  ulong *in_RDX;
  ulong *in_RSI;
  BIT_DStream_t *in_RDI;
  
  uVar1 = in_RDI->bitsConsumed;
  if (uVar1 < 0x41) {
    pcVar2 = in_RDI->ptr;
    if (pcVar2 < (char *)*in_RSI) {
      pcVar3 = (char *)*in_RDX;
      if (pcVar2 != pcVar3) {
        uVar4 = (int)pcVar2 - (int)pcVar3;
        if (pcVar3 <= pcVar2 + -(ulong)(uVar1 >> 3)) {
          uVar4 = uVar1 >> 3;
        }
        in_RDI->ptr = pcVar2 + -(ulong)uVar4;
        in_RDI->bitsConsumed = uVar1 + uVar4 * -8;
        in_RDI->bitContainer = *(size_t *)(pcVar2 + -(ulong)uVar4);
        return;
      }
    }
    else {
      BIT_reloadDStreamFast(in_RDI);
    }
  }
  return;
}

Assistant:

MEM_STATIC FORCE_INLINE_ATTR BIT_DStream_status BIT_reloadDStream(BIT_DStream_t* bitD)
{
    if (bitD->bitsConsumed > (sizeof(bitD->bitContainer)*8))  /* overflow detected, like end of stream */
        return BIT_DStream_overflow;

    if (bitD->ptr >= bitD->limitPtr) {
        return BIT_reloadDStreamFast(bitD);
    }
    if (bitD->ptr == bitD->start) {
        if (bitD->bitsConsumed < sizeof(bitD->bitContainer)*8) return BIT_DStream_endOfBuffer;
        return BIT_DStream_completed;
    }
    /* start < ptr < limitPtr */
    {   U32 nbBytes = bitD->bitsConsumed >> 3;
        BIT_DStream_status result = BIT_DStream_unfinished;
        if (bitD->ptr - nbBytes < bitD->start) {
            nbBytes = (U32)(bitD->ptr - bitD->start);  /* ptr > start */
            result = BIT_DStream_endOfBuffer;
        }
        bitD->ptr -= nbBytes;
        bitD->bitsConsumed -= nbBytes*8;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);   /* reminder : srcSize > sizeof(bitD->bitContainer), otherwise bitD->ptr == bitD->start */
        return result;
    }
}